

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

bool __thiscall
JsUtil::BackgroundJobProcessor::AreAllThreadsWaitingForJobs(BackgroundJobProcessor *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte local_11;
  BackgroundJobProcessor *pBStack_10;
  bool isAnyThreadNotWaitingForJobs;
  BackgroundJobProcessor *this_local;
  
  pBStack_10 = this;
  bVar2 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x576,"(criticalSection.IsLocked())","criticalSection.IsLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_11 = 0;
  IterateBackgroundThreads<JsUtil::BackgroundJobProcessor::AreAllThreadsWaitingForJobs()::__0>
            (this,(anon_class_8_1_e5f13fb7)&local_11);
  return (bool)((local_11 ^ 0xff) & 1);
}

Assistant:

bool BackgroundJobProcessor::AreAllThreadsWaitingForJobs()
    {
        Assert(criticalSection.IsLocked());

        bool isAnyThreadNotWaitingForJobs = false;

        this->IterateBackgroundThreads([&](ParallelThreadData *parallelThreadData)
        {
            if (parallelThreadData->isWaitingForJobs)
            {
                return false;
            }
            // At least one thread was not waiting for jobs.
            isAnyThreadNotWaitingForJobs = true;
            return true;
        });

        return !isAnyThreadNotWaitingForJobs;
    }